

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O1

void slab_unmap(slab_arena *arena,void *ptr)

{
  void *pvVar1;
  void *pvVar2;
  void *__e;
  unsigned_long _zzq_args [6];
  unsigned_long _zzq_result;
  
  if (ptr != (void *)0x0) {
    if ((long *)((ulong)ptr & 0xffffffffffff0000) != (long *)ptr) {
      __assert_fail("lf_lifo(elem) == elem",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/lf_lifo.h"
                    ,0x51,"struct lf_lifo *lf_lifo_push(struct lf_lifo *, void *)");
    }
    do {
      pvVar1 = (arena->cache).next;
      *(long *)((ulong)ptr & 0xffffffffffff0000) = (long)pvVar1;
      LOCK();
      pvVar2 = (arena->cache).next;
      if (pvVar1 == pvVar2) {
        (arena->cache).next = (void *)((ulong)((int)pvVar1 + 1U & 0xffff) + (long)ptr);
        pvVar2 = pvVar1;
      }
      UNLOCK();
    } while (pvVar1 != pvVar2);
  }
  return;
}

Assistant:

void
slab_unmap(struct slab_arena *arena, void *ptr)
{
	if (ptr == NULL)
		return;

	lf_lifo_push(&arena->cache, ptr);
	VALGRIND_MAKE_MEM_NOACCESS(ptr, arena->slab_size);
	VALGRIND_MAKE_MEM_DEFINED(lf_lifo(ptr), sizeof(struct lf_lifo));
}